

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result,string *indent)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDX;
  ostream *in_RDI;
  TestProperty *property;
  int i;
  string kProperty;
  string kProperties;
  string *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe58;
  TestResult *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  string local_a8 [32];
  TestProperty *local_88;
  int local_7c;
  undefined4 local_78;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  ostream *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator<char> *)in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator<char> *)in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator(&local_71);
  iVar1 = TestResult::test_property_count((TestResult *)0x19dabc);
  if (iVar1 < 1) {
    local_78 = 1;
  }
  else {
    poVar3 = std::operator<<(local_8,local_18);
    poVar3 = std::operator<<(poVar3,"<");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    local_7c = 0;
    while( true ) {
      iVar1 = local_7c;
      iVar2 = TestResult::test_property_count((TestResult *)0x19dbac);
      if (iVar2 <= iVar1) break;
      local_88 = TestResult::GetTestProperty
                           (in_stack_fffffffffffffe60,
                            (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      poVar3 = std::operator<<(local_8,local_18);
      poVar3 = std::operator<<(poVar3,"  <");
      std::operator<<(poVar3,local_70);
      poVar3 = std::operator<<(local_8," name=\"");
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TestProperty::key((TestProperty *)0x19dc52);
      __s = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)__s,(allocator<char> *)in_stack_fffffffffffffe80);
      EscapeXmlAttribute(in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe80 = std::operator<<(poVar3,local_a8);
      std::operator<<(in_stack_fffffffffffffe80,"\"");
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
      poVar3 = std::operator<<(local_8," value=\"");
      TestProperty::value((TestProperty *)0x19dd16);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)__s,(allocator<char> *)in_stack_fffffffffffffe80);
      EscapeXmlAttribute(in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe60 = (TestResult *)std::operator<<(poVar3,local_f0);
      std::operator<<((ostream *)in_stack_fffffffffffffe60,"\"");
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
      std::operator<<(local_8,"/>\n");
      local_7c = local_7c + 1;
    }
    poVar3 = std::operator<<(local_8,local_18);
    poVar3 = std::operator<<(poVar3,"</");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    local_78 = 0;
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result, const std::string& indent) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << indent << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << indent << "  <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << indent << "</" << kProperties << ">\n";
}